

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermConstantUnion * __thiscall
glslang::HlslParseContext::getSamplePosArray(HlslParseContext *this,int count)

{
  float fVar1;
  pointer pTVar2;
  TConstUnionArray *this_00;
  ulong uVar3;
  TArraySizes *this_01;
  TIntermConstantUnion *this_02;
  uint uVar4;
  undefined4 in_register_00000034;
  size_t s;
  tSamplePos *ptVar5;
  ulong uVar6;
  TType retType;
  
  uVar4 = count;
  switch(count - 2U >> 1 | (uint)((count - 2U & 1) != 0) << 0x1f) {
  case 0:
    ptVar5 = getSamplePosArray::pos2;
    break;
  case 1:
    ptVar5 = getSamplePosArray::pos4;
    break;
  default:
    ptVar5 = getSamplePosArray::pos1;
    uVar4 = 1;
    break;
  case 3:
    ptVar5 = getSamplePosArray::pos8;
    break;
  case 7:
    ptVar5 = getSamplePosArray::pos16;
  }
  this_00 = (TConstUnionArray *)
            TConstUnionArray::operator_new
                      ((TConstUnionArray *)0x10,CONCAT44(in_register_00000034,count));
  TConstUnionArray::TConstUnionArray(this_00,uVar4 * 2);
  uVar3 = 0;
  uVar6 = (ulong)(uint)count;
  if (count < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 * 8 != uVar3; uVar3 = uVar3 + 8) {
    fVar1 = *(float *)((long)&ptVar5->y + uVar3);
    pTVar2 = (this_00->unionArray->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)((long)&pTVar2->field_0 + uVar3 * 4) = (double)*(float *)((long)&ptVar5->x + uVar3);
    (&pTVar2->type)[uVar3] = EbtDouble;
    pTVar2 = (this_00->unionArray->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)((long)&pTVar2[1].field_0 + uVar3 * 4) = (double)fVar1;
    (&pTVar2[1].type)[uVar3] = EbtDouble;
  }
  s = 1;
  TType::TType(&retType,EbtFloat,EvqConst,2,0,0,false);
  if (uVar4 != 1) {
    this_01 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,s);
    (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
    (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    this_01->implicitArraySize = 0;
    this_01->implicitlySized = true;
    this_01->variablyIndexed = false;
    s = (size_t)uVar4;
    TArraySizes::addInnerSize(this_01,uVar4);
    retType.arraySizes = this_01;
  }
  this_02 = (TIntermConstantUnion *)TIntermNode::operator_new((TIntermNode *)0xd0,s);
  TIntermConstantUnion::TIntermConstantUnion(this_02,this_00,&retType);
  return this_02;
}

Assistant:

TIntermConstantUnion* HlslParseContext::getSamplePosArray(int count)
{
    struct tSamplePos { float x, y; };

    static const tSamplePos pos1[] = {
        { 0.0/16.0,  0.0/16.0 },
    };

    // standard sample positions for 2, 4, 8, and 16 samples.
    static const tSamplePos pos2[] = {
        { 4.0/16.0,  4.0/16.0 }, {-4.0/16.0, -4.0/16.0 },
    };

    static const tSamplePos pos4[] = {
        {-2.0/16.0, -6.0/16.0 }, { 6.0/16.0, -2.0/16.0 }, {-6.0/16.0,  2.0/16.0 }, { 2.0/16.0,  6.0/16.0 },
    };

    static const tSamplePos pos8[] = {
        { 1.0/16.0, -3.0/16.0 }, {-1.0/16.0,  3.0/16.0 }, { 5.0/16.0,  1.0/16.0 }, {-3.0/16.0, -5.0/16.0 },
        {-5.0/16.0,  5.0/16.0 }, {-7.0/16.0, -1.0/16.0 }, { 3.0/16.0,  7.0/16.0 }, { 7.0/16.0, -7.0/16.0 },
    };

    static const tSamplePos pos16[] = {
        { 1.0/16.0,  1.0/16.0 }, {-1.0/16.0, -3.0/16.0 }, {-3.0/16.0,  2.0/16.0 }, { 4.0/16.0, -1.0/16.0 },
        {-5.0/16.0, -2.0/16.0 }, { 2.0/16.0,  5.0/16.0 }, { 5.0/16.0,  3.0/16.0 }, { 3.0/16.0, -5.0/16.0 },
        {-2.0/16.0,  6.0/16.0 }, { 0.0/16.0, -7.0/16.0 }, {-4.0/16.0, -6.0/16.0 }, {-6.0/16.0,  4.0/16.0 },
        {-8.0/16.0,  0.0/16.0 }, { 7.0/16.0, -4.0/16.0 }, { 6.0/16.0,  7.0/16.0 }, {-7.0/16.0, -8.0/16.0 },
    };

    const tSamplePos* sampleLoc = nullptr;
    int numSamples = count;

    switch (count) {
    case 2:  sampleLoc = pos2;  break;
    case 4:  sampleLoc = pos4;  break;
    case 8:  sampleLoc = pos8;  break;
    case 16: sampleLoc = pos16; break;
    default:
        sampleLoc = pos1;
        numSamples = 1;
    }

    TConstUnionArray* values = new TConstUnionArray(numSamples*2);

    for (int pos=0; pos<count; ++pos) {
        TConstUnion x, y;
        x.setDConst(sampleLoc[pos].x);
        y.setDConst(sampleLoc[pos].y);

        (*values)[pos*2+0] = x;
        (*values)[pos*2+1] = y;
    }

    TType retType(EbtFloat, EvqConst, 2);

    if (numSamples != 1) {
        TArraySizes* arraySizes = new TArraySizes;
        arraySizes->addInnerSize(numSamples);
        retType.transferArraySizes(arraySizes);
    }

    return new TIntermConstantUnion(*values, retType);
}